

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVCtrl.c
# Opt level: O1

int XNVCTRLQueryTargetCount(Display *dpy,int target_type,int *value)

{
  int iVar1;
  XExtDisplayInfo *pXVar2;
  undefined1 *puVar3;
  _func_int__XDisplay_ptr *p_Var4;
  xnvCtrlQueryTargetCountReply rep;
  undefined1 auStack_48 [8];
  int local_40;
  
  pXVar2 = find_display(dpy);
  iVar1 = 0;
  if ((pXVar2 != (XExtDisplayInfo *)0x0) && (iVar1 = 0, pXVar2->codes != (XExtCodes *)0x0)) {
    if (dpy->lock_fns != (_XLockPtrs *)0x0) {
      (*dpy->lock_fns->lock_display)(dpy);
    }
    puVar3 = (undefined1 *)_XGetRequest(dpy,0x18,8);
    *puVar3 = (char)pXVar2->codes->major_opcode;
    puVar3[1] = 0x18;
    *(int *)(puVar3 + 4) = target_type;
    iVar1 = _XReply(dpy,auStack_48,0,1);
    if (iVar1 == 0) {
      if (dpy->lock_fns != (_XLockPtrs *)0x0) {
        (*dpy->lock_fns->unlock_display)(dpy);
      }
      p_Var4 = dpy->synchandler;
      iVar1 = 0;
    }
    else {
      if (value != (int *)0x0) {
        *value = local_40;
      }
      if (dpy->lock_fns != (_XLockPtrs *)0x0) {
        (*dpy->lock_fns->unlock_display)(dpy);
      }
      p_Var4 = dpy->synchandler;
      iVar1 = 1;
    }
    if (p_Var4 != (_func_int__XDisplay_ptr *)0x0) {
      (*p_Var4)(dpy);
    }
  }
  return iVar1;
}

Assistant:

Bool XNVCTRLQueryTargetCount (
    Display *dpy,
    int target_type,
    int *value
){
    XExtDisplayInfo *info = find_display (dpy);
    xnvCtrlQueryTargetCountReply  rep;
    xnvCtrlQueryTargetCountReq   *req;

    if(!XextHasExtension(info))
        return False;

    XNVCTRLCheckExtension (dpy, info, False);

    LockDisplay (dpy);
    GetReq (nvCtrlQueryTargetCount, req);
    req->reqType = info->codes->major_opcode;
    req->nvReqType = X_nvCtrlQueryTargetCount;
    req->target_type = target_type;
    if (!_XReply (dpy, (xReply *) &rep, 0, xTrue)) {
        UnlockDisplay (dpy);
        SyncHandle ();
        return False;
    }
    if (value) *value = rep.count;
    UnlockDisplay (dpy);
    SyncHandle ();
    return True;
}